

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.h
# Opt level: O3

void bs_write_ue(bs_t *b,uint32_t v)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  if (v == 0) {
    iVar2 = b->bits_left + -1;
    b->bits_left = iVar2;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar2 & 0x1f));
      *b->p = *b->p | (byte)(1 << ((byte)b->bits_left & 0x1f));
      iVar2 = b->bits_left;
    }
    if (iVar2 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      return;
    }
  }
  else {
    uVar5 = v + 1;
    if (uVar5 < 0x1000000) {
      if (uVar5 < 0x10000) {
        if (uVar5 < 0x100) {
          iVar2 = bs_write_ue::len_table[uVar5];
        }
        else {
          iVar2 = bs_write_ue::len_table[uVar5 >> 8] + 8;
        }
      }
      else {
        iVar2 = bs_write_ue::len_table[uVar5 >> 0x10] + 0x10;
      }
    }
    else {
      iVar2 = bs_write_ue::len_table[uVar5 >> 0x18] + 0x18;
    }
    if (0 < iVar2) {
      iVar4 = b->bits_left;
      uVar3 = iVar2 * 2 - 2;
      do {
        iVar4 = iVar4 + -1;
        b->bits_left = iVar4;
        pbVar1 = b->p;
        if (pbVar1 < b->end) {
          *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
          *b->p = *b->p | ((uVar5 >> (uVar3 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
          iVar4 = b->bits_left;
        }
        if (iVar4 == 0) {
          b->p = b->p + 1;
          b->bits_left = 8;
          iVar4 = 8;
        }
        bVar6 = uVar3 != 0;
        uVar3 = uVar3 - 1;
      } while (bVar6);
    }
  }
  return;
}

Assistant:

static inline void bs_write_ue(bs_t* b, uint32_t v)
{
    static const int len_table[256] =
            {
                    1,
                    1,
                    2,2,
                    3,3,3,3,
                    4,4,4,4,4,4,4,4,
                    5,5,5,5,5,5,5,5,5,5,5,5,5,5,5,5,
                    6,6,6,6,6,6,6,6,6,6,6,6,6,6,6,6,
                    6,6,6,6,6,6,6,6,6,6,6,6,6,6,6,6,
                    7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,
                    7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,
                    7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,
                    7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,7,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
                    8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,8,
            };

    int len;

    if (v == 0)
    {
        bs_write_u1(b, 1);
    }
    else
    {
        v++;

        if (v >= 0x01000000)
        {
            len = 24 + len_table[ v >> 24 ];
        }
        else if(v >= 0x00010000)
        {
            len = 16 + len_table[ v >> 16 ];
        }
        else if(v >= 0x00000100)
        {
            len =  8 + len_table[ v >>  8 ];
        }
        else
        {
            len = len_table[ v ];
        }

        bs_write_u(b, 2*len-1, v);
    }
}